

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int I420AlphaToARGBMatrix
              (uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,uint8_t *src_a,int src_stride_a,uint8_t *dst_argb,int dst_stride_argb
              ,YuvConstants *yuvconstants,int width,int height,int attenuate)

{
  code *pcVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  code *pcVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  uint local_74;
  
  auVar7._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar7._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar7._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar7._12_4_ = -(uint)(dst_argb == (uint8_t *)0x0);
  iVar3 = movmskps((int)src_u,auVar7);
  if ((height == 0 || width < 1) || iVar3 != 0) {
    iVar3 = -1;
  }
  else {
    if (height < 0) {
      local_74 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    else {
      local_74 = height;
    }
    iVar3 = libyuv::TestCpuFlag(0x40);
    bVar6 = (width & 7U) == 0;
    pcVar5 = I422AlphaToARGBRow_Any_SSSE3;
    if (bVar6) {
      pcVar5 = I422AlphaToARGBRow_SSSE3;
    }
    pcVar1 = ARGBAttenuateRow_Any_AVX2;
    if (bVar6) {
      pcVar1 = ARGBAttenuateRow_AVX2;
    }
    if (iVar3 == 0) {
      pcVar5 = I422AlphaToARGBRow_C;
    }
    iVar3 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar2 = I422AlphaToARGBRow_AVX2;
    }
    else {
      pcVar2 = I422AlphaToARGBRow_Any_AVX2;
    }
    if (iVar3 == 0) {
      pcVar2 = pcVar5;
    }
    iVar3 = libyuv::TestCpuFlag(0x40);
    if ((width & 3U) == 0) {
      pcVar5 = ARGBAttenuateRow_SSSE3;
    }
    else {
      pcVar5 = ARGBAttenuateRow_Any_SSSE3;
    }
    if (iVar3 == 0) {
      pcVar5 = ARGBAttenuateRow_C;
    }
    iVar3 = libyuv::TestCpuFlag(0x400);
    if (iVar3 == 0) {
      pcVar1 = pcVar5;
    }
    for (uVar4 = 0; local_74 != uVar4; uVar4 = uVar4 + 1) {
      (*pcVar2)(src_y,src_u,src_v,src_a,dst_argb,yuvconstants,width);
      if (attenuate != 0) {
        (*pcVar1)(dst_argb,dst_argb,width);
      }
      dst_argb = dst_argb + dst_stride_argb;
      src_a = src_a + src_stride_a;
      src_y = src_y + src_stride_y;
      src_v = src_v + (int)(-(uVar4 & 1) & src_stride_v);
      src_u = src_u + (int)(-(uVar4 & 1) & src_stride_u);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

LIBYUV_API
int I420AlphaToARGBMatrix(const uint8_t* src_y,
                          int src_stride_y,
                          const uint8_t* src_u,
                          int src_stride_u,
                          const uint8_t* src_v,
                          int src_stride_v,
                          const uint8_t* src_a,
                          int src_stride_a,
                          uint8_t* dst_argb,
                          int dst_stride_argb,
                          const struct YuvConstants* yuvconstants,
                          int width,
                          int height,
                          int attenuate) {
  int y;
  void (*I422AlphaToARGBRow)(const uint8_t* y_buf, const uint8_t* u_buf,
                             const uint8_t* v_buf, const uint8_t* a_buf,
                             uint8_t* dst_argb,
                             const struct YuvConstants* yuvconstants,
                             int width) = I422AlphaToARGBRow_C;
  void (*ARGBAttenuateRow)(const uint8_t* src_argb, uint8_t* dst_argb,
                           int width) = ARGBAttenuateRow_C;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
#if defined(HAS_I422ALPHATOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422AlphaToARGBRow = I422AlphaToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422AlphaToARGBRow = I422AlphaToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I422ALPHATOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422AlphaToARGBRow = I422AlphaToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422AlphaToARGBRow = I422AlphaToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I422ALPHATOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422AlphaToARGBRow = I422AlphaToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422AlphaToARGBRow = I422AlphaToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_I422ALPHATOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422AlphaToARGBRow = I422AlphaToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422AlphaToARGBRow = I422AlphaToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_I422ALPHATOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422AlphaToARGBRow = I422AlphaToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422AlphaToARGBRow = I422AlphaToARGBRow_MSA;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 4)) {
      ARGBAttenuateRow = ARGBAttenuateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_MMI;
    if (IS_ALIGNED(width, 2)) {
      ARGBAttenuateRow = ARGBAttenuateRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I422AlphaToARGBRow(src_y, src_u, src_v, src_a, dst_argb, yuvconstants,
                       width);
    if (attenuate) {
      ARGBAttenuateRow(dst_argb, dst_argb, width);
    }
    dst_argb += dst_stride_argb;
    src_a += src_stride_a;
    src_y += src_stride_y;
    if (y & 1) {
      src_u += src_stride_u;
      src_v += src_stride_v;
    }
  }
  return 0;
}